

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O2

void __thiscall miniros::TransportTCP::disableWrite(TransportTCP *this)

{
  bool bVar1;
  
  std::recursive_mutex::lock(&this->close_mutex_);
  bVar1 = this->closed_;
  pthread_mutex_unlock((pthread_mutex_t *)&this->close_mutex_);
  if ((bVar1 == false) && (this->expecting_write_ == true)) {
    PollSet::delEvents(this->poll_set_,this->sock_,4);
    this->expecting_write_ = false;
  }
  return;
}

Assistant:

void TransportTCP::disableWrite()
{
  MINIROS_ASSERT(!(flags_ & SYNCHRONOUS));

  {
    std::scoped_lock<std::recursive_mutex> lock(close_mutex_);

    if (closed_)
    {
      return;
    }
  }

  if (expecting_write_)
  {
    poll_set_->delEvents(sock_, POLLOUT);
    expecting_write_ = false;
  }
}